

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void * absl::base_internal::DoAllocWithArena(size_t request,Arena *arena)

{
  AllocList *pAVar1;
  int iVar2;
  uintptr_t uVar3;
  uint *puVar4;
  uintptr_t uVar5;
  Header *ptr;
  bool bVar6;
  char *absl_raw_log_internal_basename_1;
  AllocList *n;
  AllocList *prev [30];
  char *absl_raw_log_internal_basename;
  void *new_pages;
  size_t new_pages_size;
  AllocList *before;
  int i;
  size_t req_rnd;
  ArenaLock section;
  AllocList *s;
  void *result;
  Arena *arena_local;
  size_t request_local;
  
  if (request == 0) {
    return (void *)0x0;
  }
  anon_unknown_0::ArenaLock::ArenaLock((ArenaLock *)&req_rnd,arena);
  uVar3 = CheckedAdd(request,0x20);
  uVar3 = RoundUp(uVar3,arena->round_up);
  while( true ) {
    iVar2 = LLA_SkiplistLevels(uVar3,arena->min_size,(uint32_t *)0x0);
    if (iVar2 + -1 < (arena->freelist).levels) {
      new_pages_size = (size_t)&arena->freelist;
      do {
        new_pages_size = (size_t)Next(iVar2 + -1,(AllocList *)new_pages_size,arena);
        bVar6 = false;
        if ((Arena *)new_pages_size != (Arena *)0x0) {
          bVar6 = *(ulong *)new_pages_size < uVar3;
        }
        section.arena_ = (Arena *)new_pages_size;
      } while (bVar6);
      if ((Arena *)new_pages_size != (Arena *)0x0) {
        LLA_SkiplistDelete(&arena->freelist,(AllocList *)new_pages_size,&n);
        uVar5 = CheckedAdd(uVar3,arena->min_size);
        if (uVar5 <= *(ulong *)section.arena_) {
          ptr = (Header *)((long)((section.arena_)->freelist).next + (uVar3 - 0x30));
          ptr->size = *(long *)section.arena_ - uVar3;
          uVar5 = Magic(0x4c833e95,ptr);
          ptr->magic = uVar5;
          ptr->arena = arena;
          *(uintptr_t *)section.arena_ = uVar3;
          AddToFreelist(ptr + 1,arena);
        }
        uVar3 = Magic(0x4c833e95,(Header *)section.arena_);
        ((section.arena_)->freelist).header.size = uVar3;
        if ((Arena *)((section.arena_)->freelist).header.magic == arena) {
          arena->allocation_count = arena->allocation_count + 1;
          anon_unknown_0::ArenaLock::Leave((ArenaLock *)&req_rnd);
          pAVar1 = &(section.arena_)->freelist;
          anon_unknown_0::ArenaLock::~ArenaLock((ArenaLock *)&req_rnd);
          return &(pAVar1->header).dummy_for_alignment;
        }
        raw_log_internal::RawLog
                  (kFatal,"low_level_alloc.cc",0x260,"Check %s failed: %s",
                   "s->header.arena == arena","");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/base/internal/low_level_alloc.cc"
                      ,0x260,
                      "void *absl::base_internal::DoAllocWithArena(size_t, LowLevelAlloc::Arena *)")
        ;
      }
      section.arena_ = (Arena *)0x0;
    }
    SpinLock::Unlock(&arena->mu);
    uVar5 = RoundUp(uVar3,arena->pagesize << 4);
    if ((arena->flags & 2) == 0) {
      absl_raw_log_internal_basename = (char *)mmap((void *)0x0,uVar5,3,0x22,-1,0);
    }
    else {
      absl_raw_log_internal_basename = (char *)DirectMmap((void *)0x0,uVar5,3,0x22,-1,0);
    }
    if (absl_raw_log_internal_basename == (char *)0xffffffffffffffff) break;
    SpinLock::Lock(&arena->mu);
    section.arena_ = (Arena *)absl_raw_log_internal_basename;
    *(uintptr_t *)absl_raw_log_internal_basename = uVar5;
    uVar5 = Magic(0x4c833e95,(Header *)absl_raw_log_internal_basename);
    ((section.arena_)->freelist).header.size = uVar5;
    ((section.arena_)->freelist).header.magic = (uintptr_t)arena;
    AddToFreelist(&((section.arena_)->freelist).header.dummy_for_alignment,arena);
  }
  puVar4 = (uint *)__errno_location();
  raw_log_internal::RawLog(kFatal,"low_level_alloc.cc",0x23a,"mmap error: %d",(ulong)*puVar4);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/base/internal/low_level_alloc.cc"
                ,0x23a,"void *absl::base_internal::DoAllocWithArena(size_t, LowLevelAlloc::Arena *)"
               );
}

Assistant:

static void *DoAllocWithArena(size_t request, LowLevelAlloc::Arena *arena) {
  void *result = nullptr;
  if (request != 0) {
    AllocList *s;  // will point to region that satisfies request
    ArenaLock section(arena);
    // round up with header
    size_t req_rnd =
        RoundUp(CheckedAdd(request, sizeof(s->header)), arena->round_up);
    for (;;) {  // loop until we find a suitable region
      // find the minimum levels that a block of this size must have
      int i = LLA_SkiplistLevels(req_rnd, arena->min_size, nullptr) - 1;
      if (i < arena->freelist.levels) {        // potential blocks exist
        AllocList *before = &arena->freelist;  // predecessor of s
        while ((s = Next(i, before, arena)) != nullptr &&
               s->header.size < req_rnd) {
          before = s;
        }
        if (s != nullptr) {  // we found a region
          break;
        }
      }
      // we unlock before mmap() both because mmap() may call a callback hook,
      // and because it may be slow.
      arena->mu.Unlock();
      // mmap generous 64K chunks to decrease
      // the chances/impact of fragmentation:
      size_t new_pages_size = RoundUp(req_rnd, arena->pagesize * 16);
      void *new_pages;
#ifdef _WIN32
      new_pages = VirtualAlloc(nullptr, new_pages_size,
                               MEM_RESERVE | MEM_COMMIT, PAGE_READWRITE);
      ABSL_RAW_CHECK(new_pages != nullptr, "VirtualAlloc failed");
#else
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
      if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
        new_pages = base_internal::DirectMmap(nullptr, new_pages_size,
            PROT_WRITE|PROT_READ, MAP_ANONYMOUS|MAP_PRIVATE, -1, 0);
      } else {
        new_pages = mmap(nullptr, new_pages_size, PROT_WRITE | PROT_READ,
                         MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
      }
#else
      new_pages = mmap(nullptr, new_pages_size, PROT_WRITE | PROT_READ,
                       MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
#endif  // ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
      if (new_pages == MAP_FAILED) {
        ABSL_RAW_LOG(FATAL, "mmap error: %d", errno);
      }

#ifdef __linux__
#if defined(PR_SET_VMA) && defined(PR_SET_VMA_ANON_NAME)
      // Attempt to name the allocated address range in /proc/$PID/smaps on
      // Linux.
      //
      // This invocation of prctl() may fail if the Linux kernel was not
      // configured with the CONFIG_ANON_VMA_NAME option.  This is OK since
      // the naming of arenas is primarily a debugging aid.
      prctl(PR_SET_VMA, PR_SET_VMA_ANON_NAME, new_pages, new_pages_size,
            "absl");
#endif
#endif  // __linux__
#endif  // _WIN32
      arena->mu.Lock();
      s = reinterpret_cast<AllocList *>(new_pages);
      s->header.size = new_pages_size;
      // Pretend the block is allocated; call AddToFreelist() to free it.
      s->header.magic = Magic(kMagicAllocated, &s->header);
      s->header.arena = arena;
      AddToFreelist(&s->levels, arena);  // insert new region into free list
    }
    AllocList *prev[kMaxLevel];
    LLA_SkiplistDelete(&arena->freelist, s, prev);  // remove from free list
    // s points to the first free region that's big enough
    if (CheckedAdd(req_rnd, arena->min_size) <= s->header.size) {
      // big enough to split
      AllocList *n =
          reinterpret_cast<AllocList *>(req_rnd + reinterpret_cast<char *>(s));
      n->header.size = s->header.size - req_rnd;
      n->header.magic = Magic(kMagicAllocated, &n->header);
      n->header.arena = arena;
      s->header.size = req_rnd;
      AddToFreelist(&n->levels, arena);
    }
    s->header.magic = Magic(kMagicAllocated, &s->header);
    ABSL_RAW_CHECK(s->header.arena == arena, "");
    arena->allocation_count++;
    section.Leave();
    result = &s->levels;
  }
  ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(result, request);
  return result;
}